

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O3

int __thiscall
Centaurus::DFA<wchar_t>::add_state
          (DFA<wchar_t> *this,set<int,_std::less<int>,_std::allocator<int>_> *label,bool long_flag)

{
  pointer pDVar1;
  _Rep_type *p_Var2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  undefined7 in_register_00000011;
  ulong uVar5;
  _Rb_tree_const_iterator<int> __first;
  ulong uVar6;
  _Rb_tree_color *p_Var7;
  bool local_7a;
  allocator_type local_79;
  _Rb_tree_node_base *local_78;
  undefined4 local_6c;
  set<int,_std::less<int>,_std::allocator<int>_> *local_68;
  DFA<wchar_t> *local_60;
  size_t local_58;
  undefined1 local_50 [8];
  pointer local_48;
  
  pDVar1 = (this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
           super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1;
  local_7a = long_flag;
  if (lVar3 == 0) {
    __first._M_node = (label->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    local_6c = (undefined4)CONCAT71(in_register_00000011,long_flag);
    local_78 = (label->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = (label->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    p_Var2 = &label->_M_t;
    uVar6 = 0;
    uVar5 = (lVar3 >> 3) * -0x71c71c71c71c71c7;
    local_68 = label;
    local_60 = this;
    do {
      p_Var7 = *(_Rb_tree_color **)
                &pDVar1[uVar6].super_NFABaseState<wchar_t,_Centaurus::IndexVector>.m_label.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
      p_Var4 = local_78;
      if (local_58 ==
          (long)*(pointer *)
                 ((long)&pDVar1[uVar6].super_NFABaseState<wchar_t,_Centaurus::IndexVector>.m_label.
                         super_vector<int,_std::allocator<int>_> + 8) - (long)p_Var7 >> 2) {
        while( true ) {
          if ((_Rb_tree_header *)p_Var4 == &(p_Var2->_M_impl).super__Rb_tree_header) {
            pDVar1[uVar6].m_long = (bool)(pDVar1[uVar6].m_long | (byte)local_6c);
            goto LAB_0013a3c3;
          }
          if (p_Var4[1]._M_color != *p_Var7) break;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
          p_Var7 = p_Var7 + 1;
        }
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      this = local_60;
      __first._M_node = local_78;
      label = local_68;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            ((vector<int,std::allocator<int>> *)&local_48,__first,
             (_Rb_tree_const_iterator<int>)&(label->_M_t)._M_impl.super__Rb_tree_header,&local_79);
  local_50 = (undefined1  [8])&PTR__IndexVector_0019a130;
  std::vector<Centaurus::DFAState<wchar_t>,std::allocator<Centaurus::DFAState<wchar_t>>>::
  emplace_back<Centaurus::IndexVector,bool&>
            ((vector<Centaurus::DFAState<wchar_t>,std::allocator<Centaurus::DFAState<wchar_t>>> *)
             &(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states,(IndexVector *)local_50,
             &local_7a);
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48);
  }
  uVar6 = (ulong)((int)((ulong)((long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                                      super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->super_NFABase<Centaurus::DFAState<wchar_t>_>).m_states.
                                     super__Vector_base<Centaurus::DFAState<wchar_t>,_std::allocator<Centaurus::DFAState<wchar_t>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39 -
                 1);
LAB_0013a3c3:
  return (int)uVar6;
}

Assistant:

int add_state(const std::set<int>& label, bool long_flag = false)
	{
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			if (label.size() == m_states[i].label().size() && std::equal(label.cbegin(), label.cend(), m_states[i].label().cbegin()))
			{
                m_states[i].set_long(long_flag);
				return i;
			}
		}
		m_states.emplace_back(IndexVector(label.cbegin(), label.cend()), long_flag);
		return m_states.size() - 1;
	}